

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clustergraph.h
# Opt level: O0

ostream * libDAI::operator<<(ostream *os,ClusterGraph *cl)

{
  size_t sVar1;
  BipartiteGraph<libDAI::Var,_libDAI::VarSet> *pBVar2;
  ostream *i2;
  ostream *in_RSI;
  ostream *in_RDI;
  size_t I;
  size_t in_stack_ffffffffffffffc8;
  BipartiteGraph<libDAI::Var,_libDAI::VarSet> *in_stack_ffffffffffffffd0;
  BipartiteGraph<libDAI::Var,_libDAI::VarSet> *this;
  BipartiteGraph<libDAI::Var,_libDAI::VarSet> *ns;
  
  std::operator<<(in_RDI,"{");
  this = (BipartiteGraph<libDAI::Var,_libDAI::VarSet> *)0x0;
  sVar1 = BipartiteGraph<libDAI::Var,_libDAI::VarSet>::nr2
                    ((BipartiteGraph<libDAI::Var,_libDAI::VarSet> *)0xb6701c);
  if (sVar1 != 0) {
    BipartiteGraph<libDAI::Var,_libDAI::VarSet>::V2
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    operator<<(in_RSI,(VarSet *)this);
  }
  while (ns = this,
        pBVar2 = (BipartiteGraph<libDAI::Var,_libDAI::VarSet> *)
                 BipartiteGraph<libDAI::Var,_libDAI::VarSet>::nr2
                           ((BipartiteGraph<libDAI::Var,_libDAI::VarSet> *)0xb67065), this != pBVar2
        ) {
    i2 = std::operator<<(in_RDI,", ");
    BipartiteGraph<libDAI::Var,_libDAI::VarSet>::V2(this,(size_t)i2);
    operator<<(in_RSI,(VarSet *)ns);
    this = (BipartiteGraph<libDAI::Var,_libDAI::VarSet> *)
           ((long)&(ns->_V1).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                   super__Vector_impl_data._M_start + 1);
  }
  std::operator<<(in_RDI,"}");
  return in_RDI;
}

Assistant:

std::ostream & operator << ( std::ostream & os, const ClusterGraph & cl ) {
                //os << "<" << cl.nr1() << " vars, " << cl.nr2() << " clusters, " << cl.nr_edges() << " edges>: {";
                os << "{";
                size_t I = 0;
                if( I != cl.nr2() )
                    os << cl.V2(I);
                for( ; I != cl.nr2(); I++ )
                    os << ", " << cl.V2(I);
                os << "}";
                return os;
            }